

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmFileAPI.cxx
# Opt level: O3

Value * cmFileAPI::ReportCapabilities(void)

{
  Value *pVVar1;
  Value *pVVar2;
  Value *in_RDI;
  Value request;
  Value local_180;
  Value local_158;
  Value local_130;
  Value local_108;
  Value local_e0;
  Value local_b8;
  Value local_90;
  Value local_68;
  Value local_40;
  
  Json::Value::Value(in_RDI,objectValue);
  Json::Value::Value(&local_40,arrayValue);
  pVVar1 = Json::Value::operator[](in_RDI,"requests");
  pVVar1 = Json::Value::operator=(pVVar1,&local_40);
  Json::Value::~Value(&local_40);
  Json::Value::Value(&local_180,objectValue);
  Json::Value::Value(&local_68,"codemodel");
  pVVar2 = Json::Value::operator[](&local_180,"kind");
  Json::Value::operator=(pVVar2,&local_68);
  Json::Value::~Value(&local_68);
  Json::Value::Value(&local_90,arrayValue);
  pVVar2 = Json::Value::operator[](&local_180,"version");
  pVVar2 = Json::Value::operator=(pVVar2,&local_90);
  Json::Value::~Value(&local_90);
  BuildVersion(&local_158,2,0);
  Json::Value::append(pVVar2,&local_158);
  Json::Value::~Value(&local_158);
  Json::Value::append(pVVar1,&local_180);
  Json::Value::~Value(&local_180);
  Json::Value::Value(&local_180,objectValue);
  Json::Value::Value(&local_b8,"cache");
  pVVar2 = Json::Value::operator[](&local_180,"kind");
  Json::Value::operator=(pVVar2,&local_b8);
  Json::Value::~Value(&local_b8);
  Json::Value::Value(&local_e0,arrayValue);
  pVVar2 = Json::Value::operator[](&local_180,"version");
  pVVar2 = Json::Value::operator=(pVVar2,&local_e0);
  Json::Value::~Value(&local_e0);
  BuildVersion(&local_158,2,0);
  Json::Value::append(pVVar2,&local_158);
  Json::Value::~Value(&local_158);
  Json::Value::append(pVVar1,&local_180);
  Json::Value::~Value(&local_180);
  Json::Value::Value(&local_180,objectValue);
  Json::Value::Value(&local_108,"cmakeFiles");
  pVVar2 = Json::Value::operator[](&local_180,"kind");
  Json::Value::operator=(pVVar2,&local_108);
  Json::Value::~Value(&local_108);
  Json::Value::Value(&local_130,arrayValue);
  pVVar2 = Json::Value::operator[](&local_180,"version");
  pVVar2 = Json::Value::operator=(pVVar2,&local_130);
  Json::Value::~Value(&local_130);
  BuildVersion(&local_158,1,0);
  Json::Value::append(pVVar2,&local_158);
  Json::Value::~Value(&local_158);
  Json::Value::append(pVVar1,&local_180);
  Json::Value::~Value(&local_180);
  return in_RDI;
}

Assistant:

Json::Value cmFileAPI::ReportCapabilities()
{
  Json::Value capabilities = Json::objectValue;
  Json::Value& requests = capabilities["requests"] = Json::arrayValue;

  {
    Json::Value request = Json::objectValue;
    request["kind"] = ObjectKindName(ObjectKind::CodeModel);
    Json::Value& versions = request["version"] = Json::arrayValue;
    versions.append(BuildVersion(2, CodeModelV2Minor));
    requests.append(std::move(request)); // NOLINT(*)
  }

  {
    Json::Value request = Json::objectValue;
    request["kind"] = ObjectKindName(ObjectKind::Cache);
    Json::Value& versions = request["version"] = Json::arrayValue;
    versions.append(BuildVersion(2, CacheV2Minor));
    requests.append(std::move(request)); // NOLINT(*)
  }

  {
    Json::Value request = Json::objectValue;
    request["kind"] = ObjectKindName(ObjectKind::CMakeFiles);
    Json::Value& versions = request["version"] = Json::arrayValue;
    versions.append(BuildVersion(1, CMakeFilesV1Minor));
    requests.append(std::move(request)); // NOLINT(*)
  }

  return capabilities;
}